

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O3

void __thiscall Rational::normalize(Rational *this)

{
  BigInteger *this_00;
  compare_t cVar1;
  BigInteger a;
  BigInteger local_a0;
  BigInteger local_80;
  BigInteger local_60;
  BigInteger local_40;
  
  this_00 = &this->_denominator;
  BigInteger::BigInteger(&local_a0,0);
  cVar1 = BigInteger::_compare(this_00,&local_a0);
  if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (cVar1 == CMP_LESS) {
    BigInteger::operator-(&local_a0,this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this_00->digits,&local_a0.digits);
    (this->_denominator).negative = local_a0.negative;
    if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BigInteger::operator-(&local_a0,&this->_numerator);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,&local_a0.digits);
    (this->_numerator).negative = local_a0.negative;
    if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  BigInteger::BigInteger(&local_a0,0);
  cVar1 = BigInteger::_compare(&this->_numerator,&local_a0);
  if (cVar1 == CMP_LESS) {
    BigInteger::operator-(&local_80,&this->_numerator);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_80.digits,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    local_80.negative = (this->_numerator).negative;
  }
  if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_40.digits,&this_00->digits);
  local_40.negative = (this->_denominator).negative;
  gcd(&local_60,&local_80,&local_40);
  if (local_40.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  BigInteger::operator/=(&this->_numerator,&local_60);
  BigInteger::operator/=(this_00,&local_60);
  if (local_60.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Rational::normalize()
{
    if(_denominator < 0)
    {
        _denominator = -_denominator;
        _numerator = -_numerator;
    }
    BigInteger a = gcd(abs(_numerator), _denominator);
    _numerator /= a;
    _denominator /= a;
}